

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O2

int __thiscall
FormatTypeEDSK::SaveDisk
          (FormatTypeEDSK *this,char *file_path,IDisk *disk,ILoadingProgress *loading_progress)

{
  uchar uVar1;
  unsigned_short uVar2;
  int iVar3;
  ulong *puVar4;
  long lVar5;
  undefined8 *__ptr;
  byte bVar6;
  size_t __n;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  uint j;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  FILE *file;
  ulong *local_158;
  ulong local_150;
  ulong local_148;
  long local_140;
  byte local_138 [32];
  undefined2 local_118;
  undefined8 local_116;
  undefined2 local_10e;
  byte local_10c [4];
  undefined1 local_108;
  byte local_107;
  byte abStack_104 [212];
  
  iVar3 = IDisk::SmartOpen(disk,&file,file_path,".DSK");
  if (iVar3 == 0) {
    local_138[0x10] = ' ';
    local_138[0x11] = 'F';
    local_138[0x12] = 'i';
    local_138[0x13] = 'l';
    local_138[0x14] = 'e';
    local_138[0x15] = '\r';
    local_138[0x16] = '\n';
    local_138[0x17] = 'D';
    local_138[0x18] = 'i';
    local_138[0x19] = 's';
    local_138[0x1a] = 'k';
    local_138[0x1b] = '-';
    local_138[0x1c] = 'I';
    local_138[0x1d] = 'n';
    local_138[0x1e] = 'f';
    local_138[0x1f] = 'o';
    local_138[0] = 'E';
    local_138[1] = 'X';
    local_138[2] = 'T';
    local_138[3] = 'E';
    local_138[4] = 'N';
    local_138[5] = 'D';
    local_138[6] = 'E';
    local_138[7] = 'D';
    local_138[8] = ' ';
    local_138[9] = 'C';
    local_138[10] = 'P';
    local_138[0xb] = 'C';
    local_138[0xc] = ' ';
    local_138[0xd] = 'D';
    local_138[0xe] = 'S';
    local_138[0xf] = 'K';
    local_118 = 0xa0d;
    uVar10 = 0;
    memset(local_138 + 0x2c,0,0xd4);
    local_116 = 0x786f427261677553;
    local_10e = 0xa0d;
    uVar14 = disk->side_[0].nb_tracks;
    local_108 = (undefined1)uVar14;
    local_107 = disk->nb_sides_;
    uVar12 = (uint)local_107;
    uVar17 = local_107 * uVar14;
    lVar15 = (ulong)uVar17 * 0x20;
    puVar4 = (ulong *)operator_new__(lVar15 + 8);
    *puVar4 = (ulong)uVar17;
    local_158 = puVar4 + 1;
    if (uVar17 != 0) {
      lVar5 = 0;
      do {
        *(undefined8 *)((long)puVar4 + lVar5 + 0x18) = 0;
        *(undefined8 *)((long)local_158 + lVar5) = 0;
        ((undefined8 *)((long)local_158 + lVar5))[1] = 0;
        lVar5 = lVar5 + 0x20;
      } while (lVar15 != lVar5);
    }
    lVar15 = 0x34;
    for (; uVar10 < uVar14; uVar10 = uVar10 + 1) {
      lVar15 = (long)(int)lVar15;
      for (uVar14 = 0; uVar14 < uVar12; uVar14 = uVar14 + 1) {
        uVar2 = IDisk::GetTrackInfo(disk,uVar14,uVar10,
                                    (Track *)(local_158 + (ulong)(uVar12 * uVar10 + uVar14) * 4));
        uVar12 = (uint)disk->nb_sides_;
        if (uVar2 == 0) {
          bVar6 = 0;
        }
        else if ((int)puVar4[(ulong)(uVar12 * uVar10 + uVar14) * 4 + 4] == 0) {
          bVar6 = 0;
        }
        else {
          uVar17 = uVar2 + 0x100;
          if ((char)uVar2 == '\0') {
            uVar17 = (uint)uVar2;
          }
          bVar6 = (byte)(uVar17 >> 8);
        }
        local_138[lVar15] = bVar6;
        lVar15 = lVar15 + 1;
      }
      uVar14 = disk->side_[0].nb_tracks;
    }
    fwrite(local_138,0x100,1,(FILE *)file);
    puVar7 = local_158;
    for (uVar14 = 0; uVar14 < disk->side_[0].nb_tracks; uVar14 = uVar14 + 1) {
      uVar16 = 0;
      while( true ) {
        uVar12 = (uint)uVar16;
        if (disk->nb_sides_ <= uVar12) break;
        iVar3 = disk->nb_sides_ * uVar14;
        uVar11 = (ulong)(iVar3 + uVar12);
        uVar8 = puVar7[uVar11 * 4];
        uVar9 = puVar7[uVar11 * 4 + 1];
        if (uVar9 - uVar8 != 0) {
          puVar7 = puVar7 + uVar11 * 4;
          bVar6 = local_138[uVar12 + iVar3 + 0x34];
          uVar11 = (ulong)bVar6 * 0x100;
          __ptr = (undefined8 *)operator_new__(uVar11);
          uVar12 = 0;
          __n = 0;
          if (bVar6 != 0) {
            __n = uVar11 - 0xc;
          }
          local_148 = uVar11;
          memset((void *)((long)__ptr + 0xc),0,__n);
          *__ptr = 0x6e492d6b63617254;
          *(undefined4 *)(__ptr + 1) = 0xa0d6f66;
          *(char *)(__ptr + 2) = (char)uVar14;
          *(char *)((long)__ptr + 0x11) = (char)uVar16;
          *(undefined1 *)((long)__ptr + 0x14) = *(undefined1 *)(uVar8 + 0xb);
          *(char *)((long)__ptr + 0x15) = (char)((long)(uVar9 - uVar8) / 0x24);
          *(undefined1 *)((long)__ptr + 0x16) = *(undefined1 *)((long)puVar7 + 0x1c);
          *(undefined1 *)((long)__ptr + 0x17) = 0xe5;
          lVar5 = 0x100;
          lVar15 = 0x18;
          local_150 = uVar16;
          for (; (ulong)uVar12 < (ulong)((long)(uVar9 - uVar8) / 0x24); uVar12 = uVar12 + 1) {
            lVar13 = (ulong)uVar12 * 0x24;
            *(undefined1 *)((long)__ptr + lVar15) = *(undefined1 *)(uVar8 + 8 + lVar13);
            *(undefined1 *)((long)__ptr + lVar15 + 1) = *(undefined1 *)(uVar8 + 9 + lVar13);
            *(undefined1 *)((long)__ptr + lVar15 + 2) = *(undefined1 *)(uVar8 + 10 + lVar13);
            *(undefined1 *)((long)__ptr + lVar15 + 3) = *(undefined1 *)(uVar8 + 0xb + lVar13);
            *(undefined1 *)((long)__ptr + lVar15 + 4) = *(undefined1 *)(uVar8 + 0xd + lVar13);
            *(undefined1 *)((long)__ptr + lVar15 + 5) = *(undefined1 *)(uVar8 + 0xe + lVar13);
            *(undefined1 *)((long)__ptr + lVar15 + 6) = *(undefined1 *)(uVar8 + 0x10 + lVar13);
            *(undefined1 *)((long)__ptr + lVar15 + 7) = *(undefined1 *)(uVar8 + 0x11 + lVar13);
            uVar17 = *(int *)(uVar8 + 0x14 + lVar13) + 0x40;
            lVar5 = (long)(int)lVar5;
            local_140 = lVar15;
            for (uVar10 = 0; uVar10 < *(ushort *)(uVar8 + 0x10 + lVar13); uVar10 = uVar10 + 1) {
              uVar1 = IDisk::GetNextByte(disk,(int)local_150,uVar14,uVar17);
              *(uchar *)((long)__ptr + lVar5) = uVar1;
              lVar5 = lVar5 + 1;
              uVar17 = uVar17 + 0x10;
              uVar8 = *puVar7;
            }
            lVar15 = local_140 + 8;
            uVar9 = puVar7[1];
          }
          fwrite(__ptr,local_148,1,(FILE *)file);
          operator_delete__(__ptr);
          puVar7 = local_158;
          uVar16 = local_150;
        }
        uVar16 = (ulong)((int)uVar16 + 1);
      }
    }
    fclose((FILE *)file);
    uVar9 = *puVar4 * 0x20;
    uVar16 = uVar9 + 8;
    uVar8 = *puVar4;
    while (uVar8 != 0) {
      std::_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>::~_Vector_base
                ((_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)
                 ((long)puVar4 + (uVar9 - 0x18)));
      uVar9 = uVar9 - 0x20;
      uVar8 = uVar9;
    }
    operator_delete__(puVar4,uVar16);
    disk->disk_modified_ = false;
  }
  return 0;
}

Assistant:

int FormatTypeEDSK::SaveDisk(const char* file_path, IDisk* disk, ILoadingProgress* loading_progress) const
{
   FILE* file;
   int res = disk->SmartOpen(&file, file_path, ".DSK");

   if (res == 0)
   {
      // DISK INFORMATION BLOCK
      unsigned int nb_sectors = 0;
      unsigned char dib[0x100] = {0};
      memcpy(dib, "EXTENDED CPC DSK File\r\nDisk-Info\r\n", 34);
      memcpy(&dib[0x22], "SugarBox\r\n", 10);

      dib[0x30] = disk->side_[0].nb_tracks;
      dib[0x31] = disk->nb_sides_;
      //memcpy ( &dib[0x30], &m_Disk[0].NbTracks , 1 );
      //memcpy ( &dib[0x31], &m_NbSide , 1 );

      // Track size table
      // For each track :
      IDisk::Track* track = new IDisk::Track[disk->side_[0].nb_tracks * disk->nb_sides_];

      int offset = 0x34;
      for (unsigned int j = 0; j < disk->side_[0].nb_tracks; j++)
      {
         for (int i = 0; i < disk->nb_sides_; i++)
         {
            // Get size
            unsigned short size = disk->GetTrackInfo(i, j, &track[j * disk->nb_sides_ + i]);

            if (size != 0)
            {
               if (track[j * disk->nb_sides_ + i].full_size_ == 0)
               {
                  size = 0;
               }
               else if ((size & 0xFFFFFF00) < size)
               {
                  size += 0x100;
               }
            }
            dib[offset++] = (unsigned char)(size >> 8);
         }
      }
      fwrite(dib, 0x100, 1, file);

      // For each track :
      for (unsigned int j = 0; j < disk->side_[0].nb_tracks; j++)
      {
         for (int i = 0; i < disk->nb_sides_; i++)
         {
            IDisk::Track* info_track = &track[j * disk->nb_sides_ + i];

            if (info_track->list_sector_.size() > 0)
            {
               // Allocate proper size
               unsigned short size = (dib[0x34 + i + (j * disk->nb_sides_)] << 8);

               unsigned char* track_data = new unsigned char[size];
               memset(track_data, 0, size);
               // Generate track data
               memcpy(track_data, "Track-Info\r\n", 12);
               track_data[0x10] = j;
               track_data[0x11] = i;

               // SZ = First N...
               track_data[0x14] = info_track->list_sector_[0].n;
               track_data[0x15] = static_cast<unsigned char>(info_track->list_sector_.size());
               track_data[0x16] = info_track->gap3_size_;
               track_data[0x17] = 0xE5; // ?

               // Sector information list
               offset = 0x18;
               int offset_data = 0x100;
               //for (std::vector<tSector>::iterator it = info_track->listSector.begin(); it != info_track->listSector.end(); it++)
               for (unsigned int sector_index = 0; sector_index < info_track->list_sector_.size(); sector_index++)
               {
                  ++nb_sectors;
                  track_data[offset++] = info_track->list_sector_[sector_index].c; // it->C;
                  track_data[offset++] = info_track->list_sector_[sector_index].h; // it->H;
                  track_data[offset++] = info_track->list_sector_[sector_index].r; // it->R;
                  track_data[offset++] = info_track->list_sector_[sector_index].n; // it->N;
                  track_data[offset++] = info_track->list_sector_[sector_index].status1; // it->Status1;
                  track_data[offset++] = info_track->list_sector_[sector_index].status2; // ->Status2;
                  track_data[offset++] = info_track->list_sector_[sector_index].real_size & 0xFF;
                  // (it->RealSize & 0xFF);
                  track_data[offset++] = info_track->list_sector_[sector_index].real_size >> 8; // (it->RealSize >> 8);

                  // Data
                  int index = info_track->list_sector_[sector_index].dam_offset + 64;
                  // it->DAMOffset + 64; // Jump the A1A1A1F8/B 4 bytes of IDAM.

                  for (int cpt = 0; cpt < info_track->list_sector_[sector_index].real_size/*  it->RealSize*/; cpt++)
                  {
                     track_data[offset_data++] = disk->GetNextByte(i, j, index);
                     if (offset_data > size)
                     {
                        int dbg = 1;
                     }
                     index += 16;
                  }
               }
               // Write it to the disk
               fwrite(track_data, size, 1, file);

               // Free tracks
               delete[]track_data;
            }
         }
      }

      // Free ressources
      fclose(file);
      delete[]track;

      disk->disk_modified_ = false;
   }
   return 0;
}